

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_queue.h
# Opt level: O0

bool __thiscall
webrtc::
SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>::
VerifyQueueSlots(SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
                 *this)

{
  bool bVar1;
  ostream *poVar2;
  FatalMessage local_1c8;
  FatalMessageVoidify local_39;
  reference local_38;
  vector<short,_std::allocator<short>_> *v;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  *__range2;
  CritScope cs;
  SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
  *this_local;
  
  cs.cs_ = &this->crit_queue_;
  rtc::CritScope::CritScope((CritScope *)&__range2,&this->crit_queue_);
  __end0 = std::
           vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
           ::begin(&this->queue_);
  v = (vector<short,_std::allocator<short>_> *)
      std::
      vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
      ::end(&this->queue_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::vector<short,_std::allocator<short>_>_*,_std::vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>_>
                                *)&v);
    if (!bVar1) {
      rtc::CritScope::~CritScope((CritScope *)&__range2);
      return true;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<std::vector<short,_std::allocator<short>_>_*,_std::vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>_>
               ::operator*(&__end0);
    bVar1 = RenderQueueItemVerifier<short>::operator()(&this->queue_item_verifier_,local_38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::vector<short,_std::allocator<short>_>_*,_std::vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>_>
    ::operator++(&__end0);
  }
  rtc::FatalMessageVoidify::FatalMessageVoidify(&local_39);
  rtc::FatalMessage::FatalMessage
            (&local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
             ,0xb9);
  poVar2 = rtc::FatalMessage::stream(&local_1c8);
  poVar2 = std::operator<<(poVar2,"Check failed: queue_item_verifier_(v)");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"# ");
  rtc::FatalMessageVoidify::operator&(&local_39,poVar2);
  rtc::FatalMessage::~FatalMessage(&local_1c8);
}

Assistant:

bool VerifyQueueSlots() {
    rtc::CritScope cs(&crit_queue_);
    for (const auto& v : queue_) {
      RTC_DCHECK(queue_item_verifier_(v));
    }
    return true;
  }